

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import.cc
# Opt level: O2

Type * anon_unknown.dwarf_f480::load_alias(TypeNode *node,Factory *factory)

{
  string *psVar1;
  Type *pTVar2;
  char *in_RCX;
  string source;
  allocator local_79;
  string local_78;
  string local_58;
  string local_38 [32];
  
  (anonymous_namespace)::getStringAttribute_abi_cxx11_
            (&local_58,(_anonymous_namespace_ *)node->xml,(xmlNodePtr)"source",in_RCX);
  std::__cxx11::string::string((string *)&local_78,(string *)&local_58);
  pTVar2 = Factory::build(factory,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  psVar1 = (string *)factory->m_registry;
  std::__cxx11::string::string(local_38,"",&local_79);
  Typelib::Registry::alias(psVar1,(string *)&local_58,(string *)&node->name);
  std::__cxx11::string::~string(local_38);
  std::__cxx11::string::~string((string *)&local_58);
  return pTVar2;
}

Assistant:

Type const* load_alias(TypeNode const& node, Factory& factory)
    {
        string source = getAttribute<string>(node.xml, "source");
        Type const* type = factory.build(source);
        factory.alias(node, source);
        return type;
    }